

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::tMacroInput::scan(tMacroInput *this,TPpToken *ppToken)

{
  TPpContext *pTVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  char *__s1;
  reference ppTVar6;
  bool bVar7;
  byte local_51;
  value_type pTStack_38;
  bool expanded;
  TokenStream *arg;
  bool local_25;
  int i;
  bool pasting;
  int token;
  TPpToken *ppToken_local;
  tMacroInput *this_local;
  
  do {
    iVar2 = TokenStream::getToken(&this->mac->body,((this->super_tInput).pp)->parseContext,ppToken);
  } while (iVar2 == 0x20);
  bVar7 = (this->postpaste & 1U) != 0;
  if (bVar7) {
    this->postpaste = false;
  }
  if ((this->prepaste & 1U) != 0) {
    if (iVar2 != 0x97) {
      __assert_fail("token == PpAtomPaste",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/preprocessor/Pp.cpp"
                    ,0x45c,"virtual int glslang::TPpContext::tMacroInput::scan(TPpToken *)");
    }
    this->prepaste = false;
    this->postpaste = true;
  }
  local_25 = TokenStream::peekUntokenizedPasting(&this->mac->body);
  if (local_25) {
    this->prepaste = true;
  }
  local_25 = local_25 || bVar7;
  if (iVar2 == 0xa2) {
    sVar4 = std::vector<int,_glslang::pool_allocator<int>_>::size
                      ((vector<int,_glslang::pool_allocator<int>_> *)this->mac);
    arg._4_4_ = (int)sVar4;
    do {
      arg._4_4_ = arg._4_4_ + -1;
      if (arg._4_4_ < 0) break;
      pTVar1 = (this->super_tInput).pp;
      pvVar5 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                         ((vector<int,_glslang::pool_allocator<int>_> *)this->mac,(long)arg._4_4_);
      __s1 = TStringAtomMap::getString(&pTVar1->atomStrings,*pvVar5);
      iVar3 = strcmp(__s1,ppToken->name);
    } while (iVar3 != 0);
    if (-1 < arg._4_4_) {
      ppTVar6 = std::
                vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                ::operator[](&(this->expandedArgs).
                              super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                             ,(long)arg._4_4_);
      pTStack_38 = *ppTVar6;
      local_51 = 0;
      if (pTStack_38 != (value_type)0x0) {
        local_51 = local_25 ^ 0xff;
      }
      if ((pTStack_38 == (value_type)0x0) ||
         ((local_25 &&
          (bVar7 = TParseVersions::isReadingHLSL
                             (&((this->super_tInput).pp)->parseContext->super_TParseVersions),
          !bVar7)))) {
        ppTVar6 = std::
                  vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                  ::operator[](&(this->args).
                                super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                               ,(long)arg._4_4_);
        pTStack_38 = *ppTVar6;
      }
      pushTokenStreamInput
                ((this->super_tInput).pp,pTStack_38,(bool)(this->prepaste & 1),(bool)(local_51 & 1))
      ;
      iVar2 = scanToken((this->super_tInput).pp,ppToken);
      return iVar2;
    }
  }
  if (iVar2 == -1) {
    this->mac->field_0x48 = this->mac->field_0x48 & 0xfd;
  }
  return iVar2;
}

Assistant:

int TPpContext::tMacroInput::scan(TPpToken* ppToken)
{
    int token;
    do {
        token = mac->body.getToken(pp->parseContext, ppToken);
    } while (token == ' ');  // handle white space in macro

    // Hash operators basically turn off a round of macro substitution
    // (the round done on the argument before the round done on the RHS of the
    // macro definition):
    //
    // "A parameter in the replacement list, unless preceded by a # or ##
    // preprocessing token or followed by a ## preprocessing token (see below),
    // is replaced by the corresponding argument after all macros contained
    // therein have been expanded."
    //
    // "If, in the replacement list, a parameter is immediately preceded or
    // followed by a ## preprocessing token, the parameter is replaced by the
    // corresponding argument's preprocessing token sequence."

    bool pasting = false;
    if (postpaste) {
        // don't expand next token
        pasting = true;
        postpaste = false;
    }

    if (prepaste) {
        // already know we should be on a ##, verify
        assert(token == PpAtomPaste);
        prepaste = false;
        postpaste = true;
    }

    // see if are preceding a ##
    if (mac->body.peekUntokenizedPasting()) {
        prepaste = true;
        pasting = true;
    }


    // TODO: preprocessor:  properly handle whitespace (or lack of it) between tokens when expanding
    if (token == PpAtomIdentifier) {
        int i;
        for (i = (int)mac->args.size() - 1; i >= 0; i--)
            if (strcmp(pp->atomStrings.getString(mac->args[i]), ppToken->name) == 0)
                break;
        if (i >= 0) {
            TokenStream* arg = expandedArgs[i];
            bool expanded = !!arg && !pasting;
            // HLSL does expand macros before concatenation
            if (arg == nullptr || (pasting && !pp->parseContext.isReadingHLSL()) ) {
                arg = args[i];
            }
            pp->pushTokenStreamInput(*arg, prepaste, expanded);

            return pp->scanToken(ppToken);
        }
    }

    if (token == EndOfInput)
        mac->busy = 0;

    return token;
}